

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O1

void __thiscall
summaryindex::indexevents
          (summaryindex *this,string *fullfilename,
          map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
          *summaryfileperiod_to_offset,int file_id,
          map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *eventtoperiods)

{
  int *piVar1;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  FILE *pFVar5;
  size_t sVar6;
  long lVar7;
  vector<long_long,std::allocator<long_long>> *pvVar8;
  _Base_ptr p_Var9;
  char *pcVar10;
  DIR *__dirp;
  dirent *pdVar11;
  _Rb_tree_node_base *p_Var12;
  undefined8 extraout_RAX;
  uint uVar13;
  undefined4 in_register_0000000c;
  long lVar14;
  long lVar15;
  FILE *pFVar16;
  _Base_ptr p_Var17;
  map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  *this_00;
  ulong uVar18;
  int *piVar19;
  _Rb_tree_color _Var20;
  key_type *__k;
  char *pcVar21;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *pmVar22;
  summaryindex *this_01;
  summaryindex *psVar23;
  FILE *unaff_R13;
  map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  *summaryfileperiod_to_offset_00;
  pointer pbVar24;
  bool bVar25;
  longlong offset;
  int summary_set;
  int summarycalcstream_type;
  summary_period k;
  summarySampleslevelHeader sh;
  int samplesize;
  string sStack_11f8;
  value_type vStack_11d8;
  summaryindex *psStack_11b8;
  string sStack_11b0;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *pmStack_1190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_1188;
  undefined1 auStack_1170 [32];
  _Rb_tree_node_base *p_Stack_1150;
  size_t sStack_1148;
  undefined1 *apuStack_1140 [2];
  undefined1 auStack_1130 [16];
  FILE *pFStack_1120;
  summaryindex *psStack_1118;
  FILE *pFStack_1110;
  summaryindex *psStack_1108;
  key_type *pkStack_10f8;
  FILE *pFStack_10f0;
  long lStack_10e8;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *pmStack_10e0;
  FILE *pFStack_10d8;
  summaryindex *psStack_10d0;
  int aiStack_10c8 [3];
  key_type kStack_10bc;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  amStack_10b0 [85];
  long lStack_a8;
  summaryindex *psStack_a0;
  longlong local_78;
  int local_6c;
  undefined4 local_68;
  uint local_64;
  key_type local_60;
  int local_54;
  int local_50;
  long local_48;
  long local_40;
  undefined1 local_34 [4];
  
  lVar14 = CONCAT44(in_register_0000000c,file_id);
  __k = (key_type *)((ulong)summaryfileperiod_to_offset & 0xffffffff);
  pcVar21 = "rb";
  lVar15 = lVar14;
  pFVar5 = fopen(*(char **)this,"rb");
  uVar13 = (uint)lVar15;
  if (pFVar5 == (FILE *)0x0) {
    this_01 = this;
    indexevents(this);
  }
  else {
    local_78 = 0;
    local_64 = 0;
    pcVar21 = (char *)0x4;
    pFVar16 = pFVar5;
    sVar6 = fread(&local_64,4,1,pFVar5);
    uVar13 = (uint)pFVar16;
    if (sVar6 != 0) {
      local_78 = local_78 + 4;
    }
    this_01 = (summaryindex *)(ulong)(local_64 & 0x3000000);
    if ((local_64 & 0x3000000) == 0x3000000) {
      sVar6 = fread(local_34,4,1,pFVar5);
      if (sVar6 == 0) {
        local_68 = 0;
      }
      else {
        local_78 = local_78 + 4;
        local_68 = 0;
        sVar6 = fread(&local_68,4,1,pFVar5);
        if (sVar6 != 0) {
          local_6c = (int)summaryfileperiod_to_offset;
          local_78 = local_78 + 4;
          lVar15 = lVar14 + 8;
          local_40 = lVar14;
          do {
            sVar6 = fread(&local_54,0xc,1,pFVar5);
            if (sVar6 != 0) {
              lVar7 = lVar15;
              for (lVar14 = *(long *)(local_40 + 0x10); lVar14 != 0;
                  lVar14 = *(long *)(lVar14 + 0x10 + (ulong)(*(int *)(lVar14 + 0x20) < local_54) * 8
                                    )) {
                if (local_54 <= *(int *)(lVar14 + 0x20)) {
                  lVar7 = lVar14;
                }
              }
              lVar14 = lVar15;
              if ((lVar7 != lVar15) && (lVar14 = lVar7, local_54 < *(int *)(lVar7 + 0x20))) {
                lVar14 = lVar15;
              }
              if (lVar14 != lVar15) {
                local_60.summary_id = local_50;
                local_60.fileindex = local_6c;
                piVar1 = *(int **)(lVar14 + 0x30);
                local_48 = lVar15;
                for (piVar19 = *(int **)(lVar14 + 0x28); lVar15 = local_48, piVar19 != piVar1;
                    piVar19 = piVar19 + 1) {
                  local_60.period_no = *piVar19;
                  pvVar8 = (vector<long_long,std::allocator<long_long>> *)
                           std::
                           map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                           ::operator[]((map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                         *)fullfilename,&local_60);
                  iVar2._M_current = *(longlong **)(pvVar8 + 8);
                  if (iVar2._M_current == *(longlong **)(pvVar8 + 0x10)) {
                    std::vector<long_long,std::allocator<long_long>>::
                    _M_realloc_insert<long_long_const&>(pvVar8,iVar2,&local_78);
                  }
                  else {
                    *iVar2._M_current = local_78;
                    *(longlong **)(pvVar8 + 8) = iVar2._M_current + 1;
                  }
                }
              }
              local_78 = local_78 + 0xc;
            }
            bVar25 = sVar6 == 0;
            do {
              bVar3 = bVar25;
              if ((bVar3) || (sVar6 = fread(&local_60,8,1,pFVar5), sVar6 == 0)) goto LAB_0010822f;
              local_78 = local_78 + 8;
              bVar25 = false;
            } while (local_60.summary_id != 0);
          } while (!bVar3);
        }
      }
LAB_0010822f:
      fclose(pFVar5);
      return;
    }
  }
  indexevents(this_01);
  pFVar5 = (FILE *)(ulong)uVar13;
  pmVar22 = (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             *)0x10936c;
  pkStack_10f8 = (key_type *)0x108283;
  pmStack_10e0 = eventtoperiods;
  lStack_a8 = lVar14;
  psStack_a0 = this;
  pFStack_10f0 = fopen(*(char **)pcVar21,"r");
  if (pFStack_10f0 == (FILE *)0x0) {
LAB_00108417:
    pkStack_10f8 = (key_type *)0x10841f;
    indexevents((summaryindex *)pcVar21);
  }
  else {
    pmVar22 = (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)0x10936c;
    pkStack_10f8 = (key_type *)0x1082a4;
    psStack_10d0 = (summaryindex *)pcVar21;
    pFStack_10d8 = fopen(*(char **)this_01,"r");
    if (pFStack_10d8 != (FILE *)0x0) {
      pkStack_10f8 = (key_type *)0x1082c9;
      kStack_10bc.fileindex = uVar13;
      pcVar21 = fgets((char *)amStack_10b0,0x1000,pFStack_10f0);
      if (pcVar21 != (char *)0x0) {
        pcVar21 = (char *)&(pmStack_10e0->_M_t)._M_impl.super__Rb_tree_header;
        this_01 = (summaryindex *)amStack_10b0;
        __k = &kStack_10bc;
        do {
          pkStack_10f8 = (key_type *)0x1082fe;
          iVar4 = __isoc99_sscanf(this_01,"%d,%lld",__k,&lStack_10e8);
          pFVar16 = pFStack_10d8;
          if (iVar4 != 2) {
            pmVar22 = amStack_10b0;
            pkStack_10f8 = (key_type *)0x108417;
            indexevents();
            goto LAB_00108417;
          }
          pkStack_10f8 = (key_type *)0x10831b;
          fseek(pFStack_10d8,lStack_10e8,0);
          pkStack_10f8 = (key_type *)0x108332;
          fread(aiStack_10c8,0xc,1,pFVar16);
          p_Var9 = (_Base_ptr)pcVar21;
          for (p_Var17 = (pmStack_10e0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var17 != (_Base_ptr)0x0;
              p_Var17 = (&p_Var17->_M_left)[(int)p_Var17[1]._M_color < aiStack_10c8[0]]) {
            if (aiStack_10c8[0] <= (int)p_Var17[1]._M_color) {
              p_Var9 = p_Var17;
            }
          }
          p_Var17 = (_Base_ptr)pcVar21;
          if ((p_Var9 != (_Base_ptr)pcVar21) &&
             (p_Var17 = p_Var9, aiStack_10c8[0] < (int)p_Var9[1]._M_color)) {
            p_Var17 = (_Base_ptr)pcVar21;
          }
          if (p_Var17 != (_Base_ptr)pcVar21) {
            unaff_R13 = (FILE *)p_Var17[1]._M_left;
            for (pFVar16 = (FILE *)p_Var17[1]._M_parent; pFVar16 != unaff_R13;
                pFVar16 = (FILE *)&pFVar16->field_0x4) {
              kStack_10bc.period_no = pFVar16->_flags;
              pkStack_10f8 = (key_type *)0x10839a;
              pvVar8 = (vector<long_long,std::allocator<long_long>> *)
                       std::
                       map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                       ::operator[](this_00,__k);
              iVar2._M_current = *(longlong **)(pvVar8 + 8);
              if (iVar2._M_current == *(longlong **)(pvVar8 + 0x10)) {
                pkStack_10f8 = (key_type *)0x1083c3;
                std::vector<long_long,std::allocator<long_long>>::
                _M_realloc_insert<long_long_const&>(pvVar8,iVar2,&lStack_10e8);
              }
              else {
                *iVar2._M_current = lStack_10e8;
                *(longlong **)(pvVar8 + 8) = iVar2._M_current + 1;
              }
            }
          }
          pkStack_10f8 = (key_type *)0x1083da;
          pcVar10 = fgets((char *)this_01,0x1000,pFStack_10f0);
          pFVar5 = pFVar16;
        } while (pcVar10 != (char *)0x0);
      }
      pkStack_10f8 = (key_type *)0x1083ec;
      fclose(pFStack_10f0);
      pkStack_10f8 = (key_type *)0x1083f6;
      fclose(pFStack_10d8);
      return;
    }
  }
  pkStack_10f8 = (key_type *)doit;
  psVar23 = this_01;
  indexevents(this_01);
  vStack_1188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_1188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  summaryfileperiod_to_offset_00 =
       (map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        *)0x0;
  vStack_1188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_1170._24_8_ = auStack_1170 + 8;
  auStack_1170._8_4_ = _S_red;
  auStack_1170._16_8_ = (_Base_ptr)0x0;
  sStack_1148 = 0;
  psStack_11b8 = psVar23;
  pmStack_1190 = pmVar22;
  p_Stack_1150 = (_Rb_tree_node_base *)auStack_1170._24_8_;
  pFStack_1120 = pFVar5;
  psStack_1118 = (summaryindex *)pcVar21;
  pFStack_1110 = unaff_R13;
  psStack_1108 = this_01;
  pkStack_10f8 = __k;
  __dirp = opendir(*(char **)psVar23);
  if (__dirp == (DIR *)0x0) {
LAB_001088a2:
    doit(psStack_11b8);
LAB_001088ac:
    doit((summaryindex *)&vStack_11d8);
  }
  else {
    while( true ) {
      pdVar11 = readdir(__dirp);
      vStack_11d8._M_dataplus._M_p = (pointer)&vStack_11d8.field_2;
      if (pdVar11 == (dirent *)0x0) break;
      sVar6 = strlen(pdVar11->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&vStack_11d8,pdVar11->d_name,pdVar11->d_name + sVar6);
      if (vStack_11d8._M_string_length < 5) {
        bVar25 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)apuStack_1140,(ulong)&vStack_11d8);
        iVar4 = std::__cxx11::string::compare((char *)apuStack_1140);
        bVar25 = iVar4 == 0;
        if (apuStack_1140[0] != auStack_1130) {
          operator_delete(apuStack_1140[0]);
        }
      }
      if (bVar25) {
        sStack_11f8._M_dataplus._M_p = (pointer)&sStack_11f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&sStack_11f8,*(long *)psStack_11b8,
                   *(long *)(psStack_11b8 + 8) + *(long *)psStack_11b8);
        std::__cxx11::string::append((char *)&sStack_11f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&vStack_1188,&vStack_11d8);
        sStack_11b0._M_dataplus._M_p = (pointer)&sStack_11b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&sStack_11b0,sStack_11f8._M_dataplus._M_p,
                   sStack_11f8._M_dataplus._M_p + sStack_11f8._M_string_length);
        uVar18 = sStack_11f8._M_string_length - 4;
        if (sStack_11b0._M_string_length < uVar18) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase")
          ;
          goto LAB_001088a2;
        }
        sStack_11b0._M_dataplus._M_p[uVar18] = '\0';
        sStack_11b0._M_string_length = uVar18;
        std::__cxx11::string::append((char *)&sStack_11b0);
        pFVar5 = fopen(sStack_11b0._M_dataplus._M_p,"r");
        if (pFVar5 == (FILE *)0x0) {
          indexevents((summaryindex *)&sStack_11f8,(string *)auStack_1170,
                      summaryfileperiod_to_offset_00,(int)pmStack_1190,eventtoperiods);
        }
        else {
          fclose(pFVar5);
          eventtoperiods = pmStack_1190;
          indexevents(&sStack_11f8,&sStack_11b0,
                      (map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                       *)auStack_1170,(int)summaryfileperiod_to_offset_00,pmStack_1190);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_11b0._M_dataplus._M_p != &sStack_11b0.field_2) {
          operator_delete(sStack_11b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_11f8._M_dataplus._M_p != &sStack_11f8.field_2) {
          operator_delete(sStack_11f8._M_dataplus._M_p);
        }
        summaryfileperiod_to_offset_00 =
             (map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
              *)(ulong)((int)summaryfileperiod_to_offset_00 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)vStack_11d8._M_dataplus._M_p != &vStack_11d8.field_2) {
        operator_delete(vStack_11d8._M_dataplus._M_p);
      }
    }
    std::__cxx11::string::_M_construct<char*>
              ((string *)&vStack_11d8,*(long *)psStack_11b8,
               *(long *)(psStack_11b8 + 8) + *(long *)psStack_11b8);
    std::__cxx11::string::append((char *)&vStack_11d8);
    pFVar5 = fopen(vStack_11d8._M_dataplus._M_p,"wb");
    if (pFVar5 == (FILE *)0x0) goto LAB_001088ac;
    pbVar24 = vStack_1188.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (vStack_1188.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        vStack_1188.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        fprintf(pFVar5,"%s\n",(pbVar24->_M_dataplus)._M_p);
        pbVar24 = pbVar24 + 1;
      } while (pbVar24 !=
               vStack_1188.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    fclose(pFVar5);
    sStack_11f8._M_dataplus._M_p = (pointer)&sStack_11f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_11f8,*(long *)psStack_11b8,
               *(long *)(psStack_11b8 + 8) + *(long *)psStack_11b8);
    std::__cxx11::string::append((char *)&sStack_11f8);
    std::__cxx11::string::operator=((string *)&vStack_11d8,(string *)&sStack_11f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_11f8._M_dataplus._M_p != &sStack_11f8.field_2) {
      operator_delete(sStack_11f8._M_dataplus._M_p);
    }
    pFVar5 = fopen(vStack_11d8._M_dataplus._M_p,"wb");
    if (pFVar5 != (FILE *)0x0) {
      if ((_Rb_tree_node_base *)auStack_1170._24_8_ == (_Rb_tree_node_base *)(auStack_1170 + 8)) {
        _Var20 = _S_red;
      }
      else {
        _Var20 = _S_red;
        p_Var12 = (_Rb_tree_node_base *)auStack_1170._24_8_;
        do {
          if ((int)_Var20 < (int)p_Var12[1]._M_color) {
            _Var20 = p_Var12[1]._M_color;
          }
          for (p_Var17 = p_Var12[1]._M_left; p_Var17 != p_Var12[1]._M_right;
              p_Var17 = (_Base_ptr)&p_Var17->_M_parent) {
            fprintf(pFVar5,"%d, %d, %d, %lld\n",(ulong)p_Var12[1]._M_color,
                    (ulong)*(uint *)&p_Var12[1].field_0x4,(ulong)*(uint *)&p_Var12[1]._M_parent,
                    *(undefined8 *)p_Var17);
          }
          p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
        } while (p_Var12 != (_Rb_tree_node_base *)(auStack_1170 + 8));
      }
      fclose(pFVar5);
      sStack_11f8._M_dataplus._M_p = (pointer)&sStack_11f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&sStack_11f8,*(long *)psStack_11b8,
                 *(long *)(psStack_11b8 + 8) + *(long *)psStack_11b8);
      std::__cxx11::string::append((char *)&sStack_11f8);
      std::__cxx11::string::operator=((string *)&vStack_11d8,(string *)&sStack_11f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_11f8._M_dataplus._M_p != &sStack_11f8.field_2) {
        operator_delete(sStack_11f8._M_dataplus._M_p);
      }
      pFVar5 = fopen(vStack_11d8._M_dataplus._M_p,"wb");
      if (pFVar5 != (FILE *)0x0) {
        fprintf(pFVar5,"%d",(ulong)_Var20);
        fclose(pFVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vStack_11d8._M_dataplus._M_p != &vStack_11d8.field_2) {
          operator_delete(vStack_11d8._M_dataplus._M_p);
        }
        std::
        _Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     *)auStack_1170);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&vStack_1188);
        return;
      }
      goto LAB_001088c0;
    }
  }
  doit((summaryindex *)&vStack_11d8);
LAB_001088c0:
  doit((summaryindex *)&vStack_11d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_11f8._M_dataplus._M_p != &sStack_11f8.field_2) {
    operator_delete(sStack_11f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vStack_11d8._M_dataplus._M_p != &vStack_11d8.field_2) {
    operator_delete(vStack_11d8._M_dataplus._M_p);
  }
  std::
  _Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               *)auStack_1170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_1188);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void indexevents(const std::string& fullfilename, std::map<summary_period, std::vector<long long>> &summaryfileperiod_to_offset, int file_id, const std::map<int, std::vector<int>> &eventtoperiods) {
		FILE* fin = fopen(fullfilename.c_str(), "rb");
		if (fin == NULL) {
			fprintf(stderr, "%s: cannot open %s\n", __func__, fullfilename.c_str());
			exit(EXIT_FAILURE);
		}
		long long offset = 0;
		int summarycalcstream_type = 0;
		size_t i = fread(&summarycalcstream_type, sizeof(summarycalcstream_type), 1, fin);
		if (i != 0) offset += sizeof(summarycalcstream_type);
		int stream_type = summarycalcstream_type & summarycalc_id;

		if (stream_type != summarycalc_id) {
			fprintf(stderr, "%s: Not a summarycalc stream type %d\n", __func__, stream_type);
			exit(-1);
		}

		stream_type = streamno_mask & summarycalcstream_type;
		int samplesize;
		i = fread(&samplesize, sizeof(samplesize), 1, fin);
		if (i != 0) offset += sizeof(samplesize);
		int summary_set = 0;
		if (i != 0) i = fread(&summary_set, sizeof(summary_set), 1, fin);
		if (i != 0) offset += sizeof(summary_set);
		summarySampleslevelHeader sh;
		while (i != 0) {
			i = fread(&sh, sizeof(sh), 1, fin);
			if (i != 0) {
				auto iter = eventtoperiods.find(sh.event_id);
				if (iter != eventtoperiods.end()) {
					summary_period k;
					k.summary_id = sh.summary_id;
					k.fileindex = file_id;
					for (auto period : iter->second) {
						k.period_no = period;
						summaryfileperiod_to_offset[k].push_back(offset);
					}
				}
				offset += sizeof(sh);
			}
			while (i != 0) {
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, fin);
				if (i != 0) offset += sizeof(sr);
				if (i == 0) break;
				if (sr.sidx == 0) break;
			}
		}

		fclose(fin);
	}